

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger array_resize(HSQUIRRELVM v)

{
  SQObjectType SVar1;
  SQObjectPtr *pSVar2;
  SQObjectPtr *pSVar3;
  SQRESULT SVar4;
  SQInteger SVar5;
  SQInteger size;
  SQObjectPtr fill;
  
  SVar4 = 1;
  pSVar2 = stack_get(v,1);
  pSVar3 = stack_get(v,2);
  fill.super_SQObject._type = OT_NULL;
  fill.super_SQObject._unVal.pTable = (SQTable *)0x0;
  SVar1 = (pSVar3->super_SQObject)._type;
  if ((SVar1 >> 0x1a & 1) == 0) {
    SVar4 = sq_throwerror(v,"size must be a number");
  }
  else {
    if (SVar1 == OT_FLOAT) {
      size = (SQInteger)(pSVar3->super_SQObject)._unVal.fFloat;
    }
    else {
      size = (pSVar3->super_SQObject)._unVal.nInteger;
    }
    if (size < 0) {
      SVar4 = sq_throwerror(v,"resizing to negative length");
    }
    else {
      SVar5 = sq_gettop(v);
      if (2 < SVar5) {
        pSVar3 = stack_get(v,3);
        SQObjectPtr::operator=(&fill,pSVar3);
      }
      SQArray::Resize((pSVar2->super_SQObject)._unVal.pArray,size,&fill);
      sq_settop(v,1);
    }
  }
  SQObjectPtr::~SQObjectPtr(&fill);
  return SVar4;
}

Assistant:

static SQInteger array_resize(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v, 1);
    SQObject &nsize = stack_get(v, 2);
    SQObjectPtr fill;
    if(sq_isnumeric(nsize)) {
        SQInteger sz = tointeger(nsize);
        if (sz<0)
          return sq_throwerror(v, _SC("resizing to negative length"));

        if(sq_gettop(v) > 2)
            fill = stack_get(v, 3);
        _array(o)->Resize(sz,fill);
        sq_settop(v, 1);
        return 1;
    }
    return sq_throwerror(v, _SC("size must be a number"));
}